

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::Clear(ExtensionSet *this)

{
  KeyValue *pKVar1;
  KeyValue *pKVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  KeyValue *pKVar6;
  bool bVar7;
  
  lVar3 = (long)(short)this->flat_size_;
  pKVar2 = (this->map_).flat;
  if (lVar3 < 0) {
    Clear();
  }
  else {
    lVar4 = lVar3 * 0x20;
    pKVar1 = pKVar2 + lVar3;
    pKVar6 = pKVar2;
    if (this->flat_size_ != 0) {
      uVar5 = 0;
      do {
        lVar4 = lVar4 + -0x20;
        Extension::PrefetchPtr(&pKVar6->second);
        pKVar6 = pKVar6 + 1;
        if (lVar4 == 0) break;
        bVar7 = uVar5 < 0xf;
        uVar5 = uVar5 + 1;
      } while (bVar7);
    }
    for (; pKVar6 != pKVar1; pKVar6 = pKVar6 + 1) {
      Extension::Clear(&pKVar2->second);
      Extension::PrefetchPtr(&pKVar6->second);
      pKVar2 = pKVar2 + 1;
    }
    for (; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
      Extension::Clear(&pKVar2->second);
    }
  }
  return;
}

Assistant:

MessageLite* ExtensionSet::UnsafeArenaReleaseMessage(
    int number, const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      Arena* const arena = arena_;
      ret = extension->ptr.lazymessage_value->UnsafeArenaReleaseMessage(
          prototype, arena);
      if (arena == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      ret = extension->ptr.message_value;
    }
    Erase(number);
    return ret;
  }
}